

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O0

bool __thiscall miniply::PLYReader::load_ascii_list_property(PLYReader *this,PLYProperty *prop)

{
  PLYPropertyType propType;
  bool bVar1;
  uchar *puVar2;
  bool local_41;
  uint local_40;
  uint local_3c;
  uint32_t i;
  size_t back;
  size_t numBytes;
  PLYProperty *pPStack_20;
  int count;
  PLYProperty *prop_local;
  PLYReader *this_local;
  
  numBytes._4_4_ = 0;
  local_41 = false;
  pPStack_20 = prop;
  prop_local = (PLYProperty *)this;
  if ((int)prop->countType < 6) {
    bVar1 = int_literal(this,(int *)((long)&numBytes + 4));
    local_41 = false;
    if (bVar1) {
      bVar1 = advance(this);
      local_41 = false;
      if (bVar1) {
        local_41 = -1 < (int)numBytes._4_4_;
      }
    }
  }
  this->m_valid = local_41;
  if ((this->m_valid & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    back = (size_t)*(uint *)(kPLYPropertySize + (ulong)pPStack_20->type * 4);
    _i = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pPStack_20->listData);
    local_3c = numBytes._4_4_;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&pPStack_20->rowCount,&local_3c);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&pPStack_20->listData,_i + back * (long)(int)numBytes._4_4_);
    for (local_40 = 0; local_40 < numBytes._4_4_; local_40 = local_40 + 1) {
      propType = pPStack_20->type;
      puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         (&pPStack_20->listData);
      bVar1 = ascii_value(this,propType,puVar2 + _i);
      if (!bVar1) {
        this->m_valid = false;
        return false;
      }
      _i = back + _i;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool PLYReader::load_ascii_list_property(PLYProperty& prop)
  {
    int count = 0;
    m_valid = (prop.countType < PLYPropertyType::Float) && int_literal(&count) && advance() && (count >= 0);
    if (!m_valid) {
      return false;
    }

    const size_t numBytes = kPLYPropertySize[uint32_t(prop.type)];

    size_t back = prop.listData.size();
    prop.rowCount.push_back(static_cast<uint32_t>(count));
    prop.listData.resize(back + numBytes * size_t(count));

    for (uint32_t i = 0; i < uint32_t(count); i++) {
      if (!ascii_value(prop.type, prop.listData.data() + back)) {
        m_valid = false;
        return false;
      }
      back += numBytes;
    }

    return true;
  }